

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

int Sdb_StoDiffExactlyOne(Vec_Wec_t *vCuts,int Limit,int *pCut)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  uVar5 = (ulong)vCuts->nSize;
  if (0 < (long)uVar5) {
    uVar2 = *pCut + 1;
    uVar6 = 0;
    do {
      if (*pCut < 1) {
        uVar7 = 1;
      }
      else {
        uVar1 = vCuts->pArray[uVar6].nSize;
        uVar8 = 1;
        while (uVar7 = uVar8, 0 < (int)uVar1) {
          lVar10 = 0;
          do {
            iVar4 = vCuts->pArray[uVar6].pArray[lVar10];
            if (iVar4 == pCut[uVar8]) break;
            bVar11 = (ulong)uVar1 - 1 != lVar10;
            lVar10 = lVar10 + 1;
          } while (bVar11);
          if ((iVar4 != pCut[uVar8]) || (uVar8 = uVar8 + 1, uVar7 = (ulong)uVar2, uVar8 == uVar2))
          break;
        }
      }
      if ((uint)uVar7 == uVar2) {
        return -1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  if (0 < vCuts->nSize) {
    uVar6 = 0;
    do {
      if (uVar6 == (uint)Limit) {
        return -1;
      }
      uVar2 = *pCut;
      if ((int)uVar2 < 1) {
        iVar4 = -1;
        uVar7 = 1;
      }
      else {
        uVar1 = vCuts->pArray[uVar6].nSize;
        uVar7 = (ulong)uVar2 + 1;
        uVar8 = 1;
        iVar3 = -1;
        do {
          if (0 < (int)uVar1) {
            uVar9 = 0;
            do {
              iVar4 = iVar3;
              if (vCuts->pArray[uVar6].pArray[uVar9] == pCut[uVar8]) goto LAB_00681ac3;
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
          iVar4 = pCut[uVar8];
          if (iVar3 != -1) {
            uVar7 = uVar8 & 0xffffffff;
            iVar4 = iVar3;
            break;
          }
LAB_00681ac3:
          uVar8 = uVar8 + 1;
          iVar3 = iVar4;
        } while (uVar8 != uVar7);
      }
      if (((int)uVar7 == uVar2 + 1) && (iVar4 != -1)) {
        return iVar4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return -1;
}

Assistant:

int Sdb_StoDiffExactlyOne( Vec_Wec_t * vCuts, int Limit, int * pCut )
{
    Vec_Int_t * vCut;  
    int i, k, iNew;
    // check if it is fully contained in any one
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        for ( k = 1; k <= pCut[0]; k++ )
            if ( Vec_IntFind(vCut, pCut[k]) == -1 )
                break;
        if ( k == pCut[0] + 1 )
            return -1;
    }
    // check if there is one different
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        if ( i == Limit )
            break;
        for ( iNew = -1, k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
            return iNew;
    }
    return -1;
}